

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.cpp
# Opt level: O1

uint __thiscall
Memory::SmallHeapBlockT<MediumAllocationBlockAttributes>::GetMarkCountForSweep
          (SmallHeapBlockT<MediumAllocationBlockAttributes> *this)

{
  ulong *puVar1;
  code *pcVar2;
  bool bVar3;
  BVIndex BVar4;
  undefined4 *puVar5;
  SmallHeapBlockBitVector *pSVar6;
  long lVar7;
  undefined1 local_120 [8];
  SmallHeapBlockBitVector temp;
  
  if (this->freeObjectList != this->lastFreeObjectHead) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x4c5,"(IsFreeBitsValid())","IsFreeBitsValid()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  lVar7 = 0;
  memset(local_120,0,0x100);
  js_memcpy_s(local_120,0x100,this->markBits,0x100);
  pSVar6 = GetInvalidBitVector(this);
  do {
    puVar1 = (ulong *)((long)(temp.data + -1) + lVar7);
    *puVar1 = *puVar1 & ~*(ulong *)((long)&pSVar6->data[0].word + lVar7);
    lVar7 = lVar7 + 8;
  } while (lVar7 != 0x100);
  if (this->freeCount != 0) {
    lVar7 = 0;
    do {
      puVar1 = (ulong *)((long)(temp.data + -1) + lVar7);
      *puVar1 = *puVar1 & ~*(ulong *)((long)&(this->freeBits).data[0].word + lVar7);
      lVar7 = lVar7 + 8;
    } while (lVar7 != 0x100);
  }
  BVar4 = BVStatic<2048UL>::Count((BVStatic<2048UL> *)local_120);
  return BVar4;
}

Assistant:

uint
SmallHeapBlockT<TBlockAttributes>::GetMarkCountForSweep()
{
    Assert(IsFreeBitsValid());

    // Make a local copy of mark bits, so we don't modify the actual mark bits.
    SmallHeapBlockBitVector temp;
    temp.Copy(this->GetMarkedBitVector());

    // Remove any invalid bits that may have been set
    temp.Minus(this->GetInvalidBitVector());

    // Remove the mark bit for things that are still free
    if (this->freeCount != 0)
    {
        temp.Minus(this->GetFreeBitVector());
    }

    return temp.Count();
}